

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O1

uoffset_t __thiscall
flatbuffers::FlatBufferBuilderImpl<false>::ReferTo(FlatBufferBuilderImpl<false> *this,uoffset_t off)

{
  uint uVar1;
  
  if (this->minalign_ < 4) {
    this->minalign_ = 4;
  }
  vector_downward<unsigned_int>::fill(&this->buf_,(ulong)(-(this->buf_).size_ & 3));
  uVar1 = (this->buf_).size_;
  if (off - 1 < uVar1) {
    return (uVar1 - off) + 4;
  }
  __assert_fail("off && off <= size",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/flatbuffer_builder.h"
                ,0x185,
                "T flatbuffers::FlatBufferBuilderImpl<>::ReferTo(const T, const T) [Is64Aware = false, T = unsigned int]"
               );
}

Assistant:

uoffset_t ReferTo(uoffset_t off) {
    // Align to ensure GetSizeRelative32BitRegion() below is correct.
    Align(sizeof(uoffset_t));
    // 32-bit offsets are relative to the tail of the 32-bit region of the
    // buffer. For most cases (without 64-bit entities) this is equivalent to
    // size of the whole buffer (e.g. GetSize())
    return ReferTo(off, GetSizeRelative32BitRegion());
  }